

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderError9::getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError9 *this,uint n_program_object)

{
  allocator<char> local_1d;
  uint local_1c;
  TessellationShaderError9 *pTStack_18;
  uint n_program_object_local;
  TessellationShaderError9 *this_local;
  
  local_1c = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderError9 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (isolines) in;\n\npatch out vec4 test;\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 0.0, 0.0, 0.0);\n    test        = vec4(0.0, 1.0, 0.0, 0.0);\n}\n"
             ,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError9::getTessellationEvaluationShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout (isolines) in;\n"
		   "\n"
		   "patch out vec4 test;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_Position = vec4(1.0, 0.0, 0.0, 0.0);\n"
		   "    test        = vec4(0.0, 1.0, 0.0, 0.0);\n"
		   "}\n";
}